

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

char * xmlGetEncodingAlias(char *alias)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  xmlCharEncodingAliasPtr pxVar3;
  int iVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  char upper [100];
  char local_98 [112];
  
  pxVar3 = xmlCharEncodingAliases;
  if (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0 && alias != (char *)0x0) {
    pp_Var5 = __ctype_toupper_loc();
    p_Var2 = *pp_Var5;
    uVar6 = 0;
    do {
      _Var1 = p_Var2[alias[uVar6]];
      local_98[uVar6] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_001436e7;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 99);
    uVar6 = 99;
LAB_001436e7:
    local_98[uVar6 & 0xffffffff] = '\0';
    lVar7 = (long)xmlCharEncodingAliasesNb;
    if (0 < lVar7) {
      lVar8 = 0;
      do {
        iVar4 = strcmp(*(char **)((long)&pxVar3->alias + lVar8),local_98);
        if (iVar4 == 0) {
          return *(char **)((long)&pxVar3->name + lVar8);
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar7 * 0x10 != lVar8);
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
xmlGetEncodingAlias(const char *alias) {
    int i;
    char upper[100];

    if (alias == NULL)
	return(NULL);

    if (xmlCharEncodingAliases == NULL)
	return(NULL);

    for (i = 0;i < 99;i++) {
        upper[i] = toupper(alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    return(xmlCharEncodingAliases[i].name);
	}
    }
    return(NULL);
}